

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLNode * __thiscall tinyxml2::XMLElement::ShallowClone(XMLElement *this,XMLDocument *doc)

{
  XMLAttribute *pXVar1;
  char *pcVar2;
  XMLElement *this_00;
  char *value;
  XMLAttribute **ppXVar3;
  
  if (doc == (XMLDocument *)0x0) {
    doc = (this->super_XMLNode)._document;
  }
  pcVar2 = XMLNode::Value(&this->super_XMLNode);
  this_00 = XMLDocument::NewElement(doc,pcVar2);
  ppXVar3 = &this->_rootAttribute;
  while (pXVar1 = *ppXVar3, pXVar1 != (XMLAttribute *)0x0) {
    pcVar2 = StrPair::GetStr(&pXVar1->_name);
    value = StrPair::GetStr(&pXVar1->_value);
    SetAttribute(this_00,pcVar2,value);
    ppXVar3 = &pXVar1->_next;
  }
  return &this_00->super_XMLNode;
}

Assistant:

XMLNode* XMLElement::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLElement* element = doc->NewElement( Value() );					// fixme: this will always allocate memory. Intern?
    for( const XMLAttribute* a=FirstAttribute(); a; a=a->Next() ) {
        element->SetAttribute( a->Name(), a->Value() );					// fixme: this will always allocate memory. Intern?
    }
    return element;
}